

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O0

void __thiscall
sc_core::sc_signal_t<bool,_(sc_core::sc_writer_policy)3>::update
          (sc_signal_t<bool,_(sc_core::sc_writer_policy)3> *this)

{
  sc_signal_t<bool,_(sc_core::sc_writer_policy)3> *in_RDI;
  
  sc_writer_policy_nocheck_write::update((sc_writer_policy_nocheck_write *)in_RDI);
  if ((in_RDI->m_new_val & 1U) != (in_RDI->m_cur_val & 1U)) {
    do_update(in_RDI);
  }
  return;
}

Assistant:

void
sc_signal_t<T,POL>::update()
{
    policy_type::update();
    if( !( m_new_val == m_cur_val ) ) {
        do_update();
    }
}